

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_eval_edge_face_uv(REF_GRID ref_grid,REF_INT edge_geom)

{
  REF_DBL t_00;
  int node_00;
  REF_CELL ref_cell_00;
  REF_GEOM ref_geom_00;
  REF_ADJ pRVar1;
  bool bVar2;
  REF_INT RVar3;
  uint uVar4;
  REF_INT local_134;
  REF_INT local_130;
  int local_12c;
  REF_INT local_128;
  REF_INT local_124;
  REF_INT local_120;
  int local_11c;
  REF_INT local_118;
  int local_114;
  REF_INT local_110;
  bool local_109;
  REF_INT local_108;
  int local_104;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL have_jump;
  REF_INT faceid;
  int sense;
  double edgeuv [2];
  double uv [2];
  double t;
  REF_INT nodes [27];
  REF_INT face_geom;
  REF_INT cell;
  REF_INT geom_item;
  REF_INT cell_item;
  REF_INT node;
  REF_ADJ ref_adj;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_INT edge_geom_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  ref_geom_00 = ref_grid->geom;
  pRVar1 = ref_geom_00->ref_adj;
  if ((edge_geom < 0) || (ref_geom_00->max <= edge_geom)) {
    ref_grid_local._4_4_ = 3;
  }
  else if (ref_geom_00->descr[edge_geom * 6] == 1) {
    t_00 = ref_geom_00->param[edge_geom << 1];
    node_00 = ref_geom_00->descr[edge_geom * 6 + 5];
    local_109 = false;
    if ((node_00 < 0) || (pRVar1->nnode <= node_00)) {
      local_104 = -1;
    }
    else {
      local_104 = pRVar1->first[node_00];
    }
    face_geom = local_104;
    if (local_104 == -1) {
      local_108 = -1;
    }
    else {
      local_108 = pRVar1->item[local_104].ref;
    }
    nodes[0x19] = local_108;
    while (face_geom != -1) {
      if ((ref_geom_00->descr[nodes[0x19] * 6] == 2) &&
         (bVar2 = !local_109, local_109 = true, bVar2)) {
        local_109 = ref_geom_00->descr[nodes[0x19] * 6 + 3] != 0;
      }
      face_geom = pRVar1->item[face_geom].next;
      if (face_geom == -1) {
        local_110 = -1;
      }
      else {
        local_110 = pRVar1->item[face_geom].ref;
      }
      nodes[0x19] = local_110;
    }
    if (local_109) {
      if ((node_00 < 0) || (ref_cell_00->ref_adj->nnode <= node_00)) {
        local_114 = -1;
      }
      else {
        local_114 = ref_cell_00->ref_adj->first[node_00];
      }
      cell = local_114;
      if (local_114 == -1) {
        local_118 = -1;
      }
      else {
        local_118 = ref_cell_00->ref_adj->item[local_114].ref;
      }
      nodes[0x1a] = local_118;
      while (cell != -1) {
        uVar4 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&t);
        RVar3 = nodes[1];
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x39d,"ref_geom_eval_edge_face_uv",(ulong)uVar4,"cell nodes");
          return uVar4;
        }
        uVar4 = ref_geom_cell_tuv(ref_geom_00,node_00,(REF_INT *)&t,2,edgeuv + 1,&have_jump);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3a0,"ref_geom_eval_edge_face_uv",(ulong)uVar4,"cell uv");
          return uVar4;
        }
        if (have_jump == 1) {
          if ((node_00 < 0) || (pRVar1->nnode <= node_00)) {
            local_11c = -1;
          }
          else {
            local_11c = pRVar1->first[node_00];
          }
          face_geom = local_11c;
          if (local_11c == -1) {
            local_120 = -1;
          }
          else {
            local_120 = pRVar1->item[local_11c].ref;
          }
          nodes[0x19] = local_120;
          while (face_geom != -1) {
            if ((ref_geom_00->descr[nodes[0x19] * 6] == 2) &&
               (RVar3 == ref_geom_00->descr[nodes[0x19] * 6 + 1])) {
              ref_geom_00->param[nodes[0x19] << 1] = edgeuv[1];
              ref_geom_00->param[nodes[0x19] * 2 + 1] = uv[0];
            }
            face_geom = pRVar1->item[face_geom].next;
            if (face_geom == -1) {
              local_124 = -1;
            }
            else {
              local_124 = pRVar1->item[face_geom].ref;
            }
            nodes[0x19] = local_124;
          }
        }
        cell = ref_cell_00->ref_adj->item[cell].next;
        if (cell == -1) {
          local_128 = -1;
        }
        else {
          local_128 = ref_cell_00->ref_adj->item[cell].ref;
        }
        nodes[0x1a] = local_128;
      }
    }
    else {
      if ((node_00 < 0) || (pRVar1->nnode <= node_00)) {
        local_12c = -1;
      }
      else {
        local_12c = pRVar1->first[node_00];
      }
      face_geom = local_12c;
      if (local_12c == -1) {
        local_130 = -1;
      }
      else {
        local_130 = pRVar1->item[local_12c].ref;
      }
      nodes[0x19] = local_130;
      while (face_geom != -1) {
        if (ref_geom_00->descr[nodes[0x19] * 6] == 2) {
          have_jump = 0;
          uVar4 = ref_egads_edge_face_uv
                            (ref_geom_00,ref_geom_00->descr[edge_geom * 6 + 1],
                             ref_geom_00->descr[nodes[0x19] * 6 + 1],0,t_00,(REF_DBL *)&faceid);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x3b2,"ref_geom_eval_edge_face_uv",(ulong)uVar4,"edge uv");
            return uVar4;
          }
          ref_geom_00->param[nodes[0x19] << 1] = _faceid;
          ref_geom_00->param[nodes[0x19] * 2 + 1] = edgeuv[0];
        }
        face_geom = pRVar1->item[face_geom].next;
        if (face_geom == -1) {
          local_134 = -1;
        }
        else {
          local_134 = pRVar1->item[face_geom].ref;
        }
        nodes[0x19] = local_134;
      }
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    ref_grid_local._4_4_ = 3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_eval_edge_face_uv(REF_GRID ref_grid,
                                                     REF_INT edge_geom) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT node, cell_item, geom_item, cell, face_geom;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  double t;
  double uv[2], edgeuv[2];
  int sense;
  REF_INT faceid;
  REF_BOOL have_jump;

  if (edge_geom < 0 || ref_geom_max(ref_geom) <= edge_geom) return REF_INVALID;
  if (REF_GEOM_EDGE != ref_geom_type(ref_geom, edge_geom)) return REF_INVALID;

  t = ref_geom_param(ref_geom, 0, edge_geom);
  node = ref_geom_node(ref_geom, edge_geom);

  have_jump = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
      have_jump = have_jump || (0 != ref_geom_jump(ref_geom, face_geom));
    }
  }

  if (have_jump) {
    /* uv update at jump not needed, should always depend on cell_c2n */
    /* keeping for consistency with non-jump */
    each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      faceid = nodes[3];
      RSS(ref_geom_cell_tuv(ref_geom, node, nodes, REF_GEOM_FACE, uv, &sense),
          "cell uv");
      if (1 == sense) { /* sense to use is arbitrary */
        each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
          if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom) &&
              faceid == ref_geom_id(ref_geom, face_geom)) {
            ref_geom_param(ref_geom, 0, face_geom) = uv[0];
            ref_geom_param(ref_geom, 1, face_geom) = uv[1];
          }
        }
      }
    }
  } else {
    each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
        faceid = ref_geom_id(ref_geom, face_geom);
        sense = 0;
        RSS(ref_egads_edge_face_uv(ref_geom, ref_geom_id(ref_geom, edge_geom),
                                   faceid, sense, t, edgeuv),
            "edge uv");
        ref_geom_param(ref_geom, 0, face_geom) = edgeuv[0];
        ref_geom_param(ref_geom, 1, face_geom) = edgeuv[1];
      }
    }
  }

  return REF_SUCCESS;
}